

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_strrchar(char *str,char ch)

{
  char *pcVar1;
  char *pcVar2;
  
  if (ch != '\0') {
    pcVar2 = (char *)0x0;
    do {
      pcVar1 = pcVar2;
      pcVar2 = sx_strchar(str,ch);
      str = pcVar2 + 1;
    } while (pcVar2 != (char *)0x0);
    return pcVar1;
  }
  pcVar2 = sx_strchar(str,'\0');
  return pcVar2;
}

Assistant:

const char* sx_strrchar(const char* str, char ch)
{
    const char *found = NULL, *p;
    ch = (uint8_t)ch;

    if (ch == '\0')
        return sx_strchar(str, '\0');
    while ((p = sx_strchar(str, ch)) != NULL) {
        found = p;
        str = p + 1;
    }
    return (const char*)found;
}